

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O2

Vec_Vec_t * Cgt_ManDecideArea(Aig_Man_t *pAig,Vec_Vec_t *vGatesAll,int nOdcMax,int fVerbose)

{
  byte *pbVar1;
  uint uVar2;
  abctime aVar3;
  Vec_Ptr_t *p;
  void *pvVar4;
  Vec_Vec_t *vGates;
  Vec_Ptr_t *pVVar5;
  abctime aVar6;
  int nOdcMax_00;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  float fVar11;
  
  iVar10 = fVerbose;
  aVar3 = Abc_Clock();
  p = Cgt_ManCompleteGates(pAig,vGatesAll,nOdcMax_00,iVar10);
  uVar2 = p->nSize;
  uVar9 = 0;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar9 = uVar2;
    uVar7 = 0;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    pvVar4 = Vec_PtrEntry(p,uVar7);
    pbVar1 = (byte *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x18);
    *pbVar1 = *pbVar1 | 0x10;
  }
  vGates = Vec_VecStart(pAig->nRegs);
  for (iVar10 = 0; iVar10 < vGatesAll->nSize; iVar10 = iVar10 + 1) {
    iVar8 = 0;
    while( true ) {
      pVVar5 = Vec_VecEntry(vGatesAll,iVar10);
      if (pVVar5->nSize <= iVar8) break;
      pVVar5 = Vec_VecEntry(vGatesAll,iVar10);
      pvVar4 = Vec_PtrEntry(pVVar5,iVar8);
      if ((*(byte *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x18) & 0x10) != 0) {
        Vec_VecPush(vGates,iVar10,pvVar4);
      }
      iVar8 = iVar8 + 1;
    }
  }
  for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    pvVar4 = Vec_PtrEntry(p,uVar7);
    pbVar1 = (byte *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 0x18);
    *pbVar1 = *pbVar1 & 0xef;
  }
  iVar8 = 0;
  iVar10 = vGates->nSize;
  if (vGates->nSize < 1) {
    iVar10 = 0;
  }
  uVar9 = 0;
  for (; iVar10 != iVar8; iVar8 = iVar8 + 1) {
    pVVar5 = Vec_VecEntry(vGates,iVar8);
    uVar9 = uVar9 + (0 < pVVar5->nSize);
  }
  if (fVerbose != 0) {
    uVar7 = Vec_VecSizeSize(vGatesAll);
    printf("Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n",(ulong)uVar7,
           (ulong)uVar9,(ulong)(uint)pAig->nRegs);
    fVar11 = Cgt_ManComputeCoverage(pAig,vGates);
    iVar10 = 0x7fd67d;
    printf("Complete gates = %6d. Gated transitions = %5.2f %%. ",(double)fVar11,(ulong)uVar2);
    Abc_Print(iVar10,"%s =","Time");
    aVar6 = Abc_Clock();
    Abc_Print(iVar10,"%9.2f sec\n",(double)(aVar6 - aVar3) / 1000000.0);
  }
  Vec_PtrFree(p);
  return vGates;
}

Assistant:

Vec_Vec_t * Cgt_ManDecideArea( Aig_Man_t * pAig, Vec_Vec_t * vGatesAll, int nOdcMax, int fVerbose )
{
    Vec_Vec_t * vGates;
    Vec_Ptr_t * vCompletes, * vOne;
    Aig_Obj_t * pGate;
    int i, k, Counter = 0;
    abctime clk = Abc_Clock();
    // derive and label complete gates
    vCompletes = Cgt_ManCompleteGates( pAig, vGatesAll, nOdcMax, fVerbose );
    // label complete gates
    Vec_PtrForEachEntry( Aig_Obj_t *, vCompletes, pGate, i )
        Aig_Regular(pGate)->fMarkA = 1;
    // select only complete gates
    vGates = Vec_VecStart( Saig_ManRegNum(pAig) );
    Vec_VecForEachEntry( Aig_Obj_t *, vGatesAll, pGate, i, k )
        if ( Aig_Regular(pGate)->fMarkA )
            Vec_VecPush( vGates, i, pGate );
    // unlabel complete gates
    Vec_PtrForEachEntry( Aig_Obj_t *, vCompletes, pGate, i )
        Aig_Regular(pGate)->fMarkA = 0;
    // count the number of gated flops
    Vec_VecForEachLevel( vGates, vOne, i )
    {
        Counter += (int)(Vec_PtrSize(vOne) > 0);
//        printf( "%d ", Vec_PtrSize(vOne) );
    }
//    printf( "\n" );
    if ( fVerbose )
    {
        printf( "Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n", 
            Vec_VecSizeSize(vGatesAll), Counter, Saig_ManRegNum(pAig) );
        printf( "Complete gates = %6d. Gated transitions = %5.2f %%. ", 
            Vec_PtrSize(vCompletes), Cgt_ManComputeCoverage(pAig, vGates) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    Vec_PtrFree( vCompletes );
    return vGates;
}